

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O1

uint32_t __thiscall
embree::OBJLoader::getVertex
          (OBJLoader *this,
          map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
          *vertexMap,Ref<embree::SceneGraph::TriangleMeshNode> *mesh,Vertex *i)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  Vec3fa *pVVar4;
  TriangleMeshNode *pTVar5;
  pointer pVVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  ulong uVar12;
  iterator iVar13;
  Vec3fa *pVVar14;
  long lVar15;
  pointer pVVar16;
  mapped_type *pmVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint32_t uVar21;
  ulong uVar22;
  pointer pvVar23;
  size_t *psVar24;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_38;
  
  iVar13 = std::
           _Rb_tree<embree::Vertex,_std::pair<const_embree::Vertex,_unsigned_int>,_std::_Select1st<std::pair<const_embree::Vertex,_unsigned_int>_>,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
           ::find(&vertexMap->_M_t,i);
  if ((_Rb_tree_header *)iVar13._M_node == &(vertexMap->_M_t)._M_impl.super__Rb_tree_header) {
    if ((ulong)i->v < (this->v).size_active) {
      pvVar23 = (mesh->ptr->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar3 = pvVar23->size_active;
      uVar19 = pvVar23->size_alloced;
      uVar18 = sVar3 + 1;
      uVar22 = uVar19;
      if ((uVar19 < uVar18) && (uVar22 = uVar18, uVar20 = uVar19, uVar19 != 0)) {
        for (; uVar22 = uVar20, uVar20 < uVar18; uVar20 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0)) {
        }
      }
      pVVar4 = (this->v).items + i->v;
      fVar7 = (pVVar4->field_0).m128[0];
      fVar8 = (pVVar4->field_0).m128[1];
      fVar9 = (pVVar4->field_0).m128[2];
      fVar10 = (pVVar4->field_0).m128[3];
      if (uVar19 != uVar22) {
        pVVar4 = pvVar23->items;
        pVVar14 = (Vec3fa *)alignedMalloc(uVar22 << 4,0x10);
        pvVar23->items = pVVar14;
        if (pvVar23->size_active != 0) {
          lVar15 = 0;
          uVar18 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar4->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar1 = (undefined8 *)((long)&pvVar23->items->field_0 + lVar15);
            *puVar1 = *puVar2;
            puVar1[1] = uVar11;
            uVar18 = uVar18 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar18 < pvVar23->size_active);
        }
        alignedFree(pVVar4);
        pvVar23->size_active = sVar3;
        pvVar23->size_alloced = uVar22;
      }
      sVar3 = pvVar23->size_active;
      pvVar23->size_active = sVar3 + 1;
      pVVar4 = pvVar23->items + sVar3;
      (pVVar4->field_0).m128[0] = fVar7;
      (pVVar4->field_0).m128[1] = fVar8;
      (pVVar4->field_0).m128[2] = fVar9;
      (pVVar4->field_0).m128[3] = fVar10;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"WARNING: corrupted OBJ file",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
    }
    if (i->vn != 0xffffffff) {
      pvVar23 = (mesh->ptr->normals).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = pvVar23->size_active;
      uVar18 = ((mesh->ptr->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->size_active;
      if (uVar19 < uVar18) {
        do {
          psVar24 = &pvVar23->size_active;
          uVar18 = uVar19 + 1;
          uVar22 = pvVar23->size_alloced;
          uVar20 = uVar22;
          if ((uVar22 < uVar18) && (uVar20 = uVar18, uVar12 = uVar22, uVar22 != 0)) {
            for (; uVar20 = uVar12, uVar12 < uVar18; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0))
            {
            }
          }
          if (uVar22 != uVar20) {
            pVVar4 = pvVar23->items;
            pVVar14 = (Vec3fa *)alignedMalloc(uVar20 << 4,0x10);
            pvVar23->items = pVVar14;
            if (*psVar24 != 0) {
              lVar15 = 0;
              uVar18 = 0;
              do {
                puVar2 = (undefined8 *)((long)&pVVar4->field_0 + lVar15);
                uVar11 = puVar2[1];
                puVar1 = (undefined8 *)((long)&pvVar23->items->field_0 + lVar15);
                *puVar1 = *puVar2;
                puVar1[1] = uVar11;
                uVar18 = uVar18 + 1;
                lVar15 = lVar15 + 0x10;
              } while (uVar18 < *psVar24);
            }
            alignedFree(pVVar4);
            *psVar24 = uVar19;
            pvVar23->size_alloced = uVar20;
          }
          pVVar4 = pvVar23->items;
          sVar3 = *psVar24;
          *psVar24 = sVar3 + 1;
          *(undefined8 *)&pVVar4[sVar3].field_0 = 0;
          *(undefined8 *)((long)&pVVar4[sVar3].field_0 + 8) = 0;
          pvVar23 = (mesh->ptr->normals).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar19 = pvVar23->size_active;
          uVar18 = ((mesh->ptr->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size_active;
        } while (uVar19 < uVar18);
      }
      if ((ulong)i->vn < (this->vn).size_active) {
        pVVar14 = pvVar23->items;
        pVVar4 = (this->vn).items + i->vn;
        uVar11 = *(undefined8 *)((long)&pVVar4->field_0 + 8);
        *(undefined8 *)&pVVar14[uVar18 - 1].field_0 = *(undefined8 *)&pVVar4->field_0;
        *(undefined8 *)((long)&pVVar14[uVar18 - 1].field_0 + 8) = uVar11;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"WARNING: corrupted OBJ file",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
    }
    if (i->vt != 0xffffffff) {
      pTVar5 = mesh->ptr;
      pVVar16 = (pTVar5->texcoords).
                super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar18 = ((pTVar5->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->size_active;
      if ((ulong)((long)(pTVar5->texcoords).
                        super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >> 3) < uVar18) {
        do {
          local_38 = (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0;
          std::vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>>::
          emplace_back<embree::Vec2<float>>
                    ((vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *)
                     &pTVar5->texcoords,(Vec2<float> *)&local_38.field_0);
          pTVar5 = mesh->ptr;
          pVVar16 = (pTVar5->texcoords).
                    super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar18 = ((pTVar5->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size_active;
        } while ((ulong)((long)(pTVar5->texcoords).
                               super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >> 3) <
                 uVar18);
      }
      uVar19 = (ulong)i->vt;
      pVVar6 = (this->vt).
               super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar19 < (ulong)((long)(this->vt).
                                 super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 3)) {
        pVVar16[uVar18 - 1].field_0.field_0.x = pVVar6[uVar19].field_0.field_0.x;
        pVVar16[uVar18 - 1].field_0.field_0.y = pVVar6[uVar19].field_0.field_0.y;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"WARNING: corrupted OBJ file",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
    }
    uVar21 = (int)((mesh->ptr->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->size_active - 1;
    pmVar17 = std::
              map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
              ::operator[](vertexMap,i);
    *pmVar17 = uVar21;
  }
  else {
    uVar21 = *(uint32_t *)((long)&iVar13._M_node[1]._M_parent + 4);
  }
  return uVar21;
}

Assistant:

uint32_t OBJLoader::getVertex(std::map<Vertex,uint32_t>& vertexMap, Ref<SceneGraph::TriangleMeshNode> mesh, const Vertex& i)
  {
    const std::map<Vertex, uint32_t>::iterator& entry = vertexMap.find(i);
    if (entry != vertexMap.end()) return(entry->second);
    
    if (i.v >= v.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
    else mesh->positions[0].push_back(v[i.v]);
      
    if (i.vn != -1) {
      while (mesh->normals[0].size() < mesh->positions[0].size()) mesh->normals[0].push_back(zero); // some vertices might not had a normal

      if (i.vn >= vn.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->normals[0][mesh->positions[0].size()-1] = vn[i.vn];
    }
    if (i.vt != -1) {
      while (mesh->texcoords.size() < mesh->positions[0].size()) mesh->texcoords.push_back(zero); // some vertices might not had a texture coordinate

      if (i.vt >= vt.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->texcoords[mesh->positions[0].size()-1] = vt[i.vt];
    }
    return (vertexMap[i] = (unsigned int)(mesh->positions[0].size()) - 1);
  }